

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThanEquals,true,false,false,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t *piVar11;
  sel_t sVar12;
  long lVar13;
  ulong uVar14;
  unsigned_long uVar15;
  
  if (count + 0x3f < 0x40) {
    lVar13 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar13 = 0;
    uVar7 = 0;
    uVar10 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar15 = 0xffffffffffffffff;
      }
      else {
        uVar15 = puVar1[uVar7];
      }
      uVar14 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar14 = count;
      }
      uVar8 = uVar10;
      if (uVar15 == 0xffffffffffffffff) {
        if (uVar10 < uVar14) {
          psVar2 = sel->sel_vector;
          uVar9 = ldata->lower;
          lVar5 = ldata->upper;
          psVar3 = false_sel->sel_vector;
          piVar11 = &rdata[uVar10].upper;
          do {
            uVar8 = uVar10;
            if (psVar2 != (sel_t *)0x0) {
              uVar8 = (ulong)psVar2[uVar10];
            }
            lVar6 = *piVar11;
            uVar4 = ((hugeint_t *)(piVar11 + -1))->lower;
            psVar3[lVar13] = (sel_t)uVar8;
            lVar13 = lVar13 + (ulong)(uVar9 < uVar4 && lVar6 == lVar5 ||
                                     lVar6 != lVar5 && lVar5 <= lVar6);
            uVar10 = uVar10 + 1;
            piVar11 = piVar11 + 2;
            uVar8 = uVar10;
          } while (uVar14 != uVar10);
        }
      }
      else if (uVar15 == 0) {
        uVar8 = uVar14;
        if (uVar10 < uVar14) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar12 = (sel_t)uVar10;
            if (psVar2 != (sel_t *)0x0) {
              sVar12 = psVar2[uVar10];
            }
            psVar3[lVar13] = sVar12;
            lVar13 = lVar13 + 1;
            uVar10 = uVar10 + 1;
          } while (uVar14 != uVar10);
        }
      }
      else if (uVar10 < uVar14) {
        psVar2 = sel->sel_vector;
        psVar3 = false_sel->sel_vector;
        piVar11 = &rdata[uVar10].upper;
        uVar8 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar12 = (int)uVar10 + (int)uVar8;
          }
          else {
            sVar12 = psVar2[uVar10 + uVar8];
          }
          if ((uVar15 >> (uVar8 & 0x3f) & 1) == 0) {
            uVar9 = 1;
          }
          else {
            lVar5 = *piVar11;
            lVar6 = ldata->upper;
            uVar9 = (ulong)(ldata->lower < ((hugeint_t *)(piVar11 + -1))->lower && lVar5 == lVar6 ||
                           lVar5 != lVar6 && lVar6 <= lVar5);
          }
          psVar3[lVar13] = sVar12;
          lVar13 = lVar13 + uVar9;
          uVar8 = uVar8 + 1;
          piVar11 = piVar11 + 2;
        } while ((uVar10 - uVar14) + uVar8 != 0);
        uVar8 = uVar10 + uVar8;
      }
      uVar7 = uVar7 + 1;
      uVar10 = uVar8;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return count - lVar13;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}